

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_tuple_primitive_size
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  size_t value;
  sysbvm_tuple_t sVar1;
  sysbvm_tuple_t *arguments_local;
  size_t argumentCount_local;
  sysbvm_tuple_t closure_local;
  sysbvm_context_t *context_local;
  
  if (argumentCount != 1) {
    sysbvm_error_argumentCountMismatch(1,argumentCount);
  }
  value = sysbvm_tuple_getSizeInSlots(*arguments);
  sVar1 = sysbvm_tuple_size_encode(context,value);
  return sVar1;
}

Assistant:

static sysbvm_tuple_t sysbvm_tuple_primitive_size(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 1) sysbvm_error_argumentCountMismatch(1, argumentCount);

    return sysbvm_tuple_size_encode(context, sysbvm_tuple_getSizeInSlots(arguments[0]));
}